

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestSpecParser::processOtherChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char c_local;
  TestSpecParser *this_local;
  
  bVar1 = isControlChar(this,c);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&this->m_substring,c);
    endMode(this);
  }
  return bVar1;
}

Assistant:

bool TestSpecParser::processOtherChar( char c ) {
        if( !isControlChar( c ) )
            return false;
        m_substring += c;
        endMode();
        return true;
    }